

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

bool __thiscall ON_SubDHeap::ReturnVertexEdgeAndFaceArrays(ON_SubDHeap *this,ON_SubDVertex *v)

{
  ON_SubDVertex *v_local;
  ON_SubDHeap *this_local;
  
  if (v == (ON_SubDVertex *)0x0) {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  else {
    if (((v->m_edges != (ON_SubDEdgePtr *)0x0) || (v->m_edge_capacity != 0)) ||
       (v->m_edge_count != 0)) {
      ReturnArray(this,(ulong)v->m_edge_capacity,&v->m_edges->m_ptr);
      v->m_edges = (ON_SubDEdgePtr *)0x0;
      v->m_edge_capacity = 0;
      v->m_edge_count = 0;
    }
    if (((v->m_faces != (ON_SubDFace **)0x0) || (v->m_face_capacity != 0)) || (v->m_face_count != 0)
       ) {
      ReturnArray(this,(ulong)v->m_face_capacity,(ON__UINT_PTR *)v->m_faces);
      v->m_faces = (ON_SubDFace **)0x0;
      v->m_face_capacity = 0;
      v->m_face_count = 0;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDHeap::ReturnVertexEdgeAndFaceArrays(
  ON_SubDVertex* v
  )
{
  if ( nullptr == v )
    return ON_SUBD_RETURN_ERROR(false);
  if (nullptr != v->m_edges || v->m_edge_capacity > 0 || v->m_edge_count > 0)
  {
    ReturnArray(v->m_edge_capacity,(ON__UINT_PTR*)v->m_edges);
    v->m_edges = nullptr;
    v->m_edge_capacity = 0;
    v->m_edge_count = 0;
  }
  if (nullptr != v->m_faces || v->m_face_capacity > 0 || v->m_face_count > 0)
  {
    ReturnArray(v->m_face_capacity,(ON__UINT_PTR*)v->m_faces);
    v->m_faces = nullptr;
    v->m_face_capacity = 0;
    v->m_face_count = 0;
  }
  return true;

}